

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesSchedulerGetTimeoutModeProperties
          (zes_sched_handle_t hScheduler,ze_bool_t getDefaults,
          zes_sched_timeout_properties_t *pConfig)

{
  zes_pfnSchedulerGetTimeoutModeProperties_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnSchedulerGetTimeoutModeProperties_t pfnGetTimeoutModeProperties;
  zes_sched_timeout_properties_t *pConfig_local;
  ze_bool_t getDefaults_local;
  zes_sched_handle_t hScheduler_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Scheduler).pfnGetTimeoutModeProperties;
    if (p_Var1 == (zes_pfnSchedulerGetTimeoutModeProperties_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hScheduler_local._4_4_ = (*p_Var1)(hScheduler,getDefaults,pConfig);
    }
  }
  else {
    hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hScheduler_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesSchedulerGetTimeoutModeProperties(
    zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
    ze_bool_t getDefaults,                          ///< [in] If TRUE, the driver will return the system default properties for
                                                    ///< this mode, otherwise it will return the current properties.
    zes_sched_timeout_properties_t* pConfig         ///< [in,out] Will contain the current parameters for this mode.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnSchedulerGetTimeoutModeProperties_t pfnGetTimeoutModeProperties = [&result] {
        auto pfnGetTimeoutModeProperties = ze_lib::context->zesDdiTable.load()->Scheduler.pfnGetTimeoutModeProperties;
        if( nullptr == pfnGetTimeoutModeProperties ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetTimeoutModeProperties;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetTimeoutModeProperties( hScheduler, getDefaults, pConfig );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetTimeoutModeProperties = ze_lib::context->zesDdiTable.load()->Scheduler.pfnGetTimeoutModeProperties;
    if( nullptr == pfnGetTimeoutModeProperties ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetTimeoutModeProperties( hScheduler, getDefaults, pConfig );
    #endif
}